

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O2

plutovg_font_face_t * plutovg_font_face_load_from_file(char *filename,int ttcindex)

{
  FILE *__stream;
  size_t __size;
  void *__ptr;
  size_t sVar1;
  plutovg_font_face_t *ppVar2;
  uint length;
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __size = ftell(__stream);
    if ((__size != 0xffffffffffffffff) && (__ptr = malloc(__size), __ptr != (void *)0x0)) {
      fseek(__stream,0,0);
      length = 1;
      sVar1 = fread(__ptr,1,__size,__stream);
      fclose(__stream);
      if (sVar1 != __size) {
        free(__ptr);
        return (plutovg_font_face_t *)0x0;
      }
      ppVar2 = plutovg_font_face_load_from_data(__ptr,length,ttcindex,free,__ptr);
      return ppVar2;
    }
    fclose(__stream);
  }
  return (plutovg_font_face_t *)0x0;
}

Assistant:

plutovg_font_face_t* plutovg_font_face_load_from_file(const char* filename, int ttcindex)
{
    FILE* fp = fopen(filename, "rb");
    if(fp == NULL) {
        return NULL;
    }

    fseek(fp, 0, SEEK_END);
    long length = ftell(fp);
    if(length == -1L) {
        fclose(fp);
        return NULL;
    }

    void* data = malloc(length);
    if(data == NULL) {
        fclose(fp);
        return NULL;
    }

    fseek(fp, 0, SEEK_SET);
    size_t nread = fread(data, 1, length, fp);
    fclose(fp);

    if(nread != length) {
        free(data);
        return NULL;
    }

    return plutovg_font_face_load_from_data(data, length, ttcindex, free, data);
}